

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugins.c
# Opt level: O1

int ly_register_exts(lyext_plugin_list *plugin,char *log_name)

{
  undefined8 *puVar1;
  uint *puVar2;
  lyext_plugin *plVar3;
  ulong uVar4;
  uint16_t uVar5;
  int iVar6;
  lyext_plugin_list *plVar7;
  char *pcVar8;
  LY_ERR no;
  ulong uVar9;
  uint *puVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  lyext_plugin_list *plVar14;
  char *pcVar15;
  char *local_38;
  
  plVar7 = ext_plugins;
  uVar5 = ext_plugins_count;
  local_38 = plugin->name;
  if (local_38 == (char *)0x0) {
    uVar11 = 0;
  }
  else {
    uVar4 = (ulong)ext_plugins_count;
    uVar12 = 0;
    plVar14 = plugin;
    do {
      if (uVar5 != 0) {
        lVar13 = 0;
        do {
          iVar6 = strcmp(local_38,*(char **)((long)&plVar7->name + lVar13));
          if (iVar6 == 0) {
            pcVar15 = plVar14->module;
            iVar6 = strcmp(pcVar15,*(char **)((long)&plVar7->module + lVar13));
            if ((iVar6 == 0) &&
               (((plVar14->revision == (char *)0x0 ||
                 (pcVar8 = *(char **)((long)&plVar7->revision + lVar13), pcVar8 == (char *)0x0)) ||
                (iVar6 = strcmp(plVar14->revision,pcVar8), iVar6 == 0)))) {
              pcVar8 = 
              "Processing \"%s\" extension plugin failed,implementation collision for extension %s from module %s%s%s."
              ;
              no = LY_ESYS;
              goto LAB_00172a45;
            }
          }
          lVar13 = lVar13 + 0x20;
        } while (uVar4 << 5 != lVar13);
      }
      if (((plVar14->plugin->type == LYEXT_COMPLEX) &&
          (puVar2 = *(uint **)(plVar14->plugin + 1), puVar2 != (uint *)0x0)) &&
         (uVar11 = *puVar2, uVar11 != 0)) {
        uVar9 = 1;
        puVar10 = puVar2;
        do {
          if (((0x37 < (int)uVar11) || (uVar11 == 0x16)) || (uVar11 == 0x13)) {
            pcVar15 = ly_stmt_str[(int)uVar11];
            pcVar8 = 
            "Extension plugin \"%s\" (extension %s) allows not supported extension substatement (%s)"
            ;
LAB_00172a3c:
            no = LY_EINVAL;
LAB_00172a45:
            ly_log((ly_ctx *)0x0,LY_LLERR,no,pcVar8,log_name,local_38,pcVar15);
            return 1;
          }
          if ((uVar11 - 0x14 < 7) && (1 < puVar10[4])) {
            pcVar15 = ly_stmt_str[uVar11];
            pcVar8 = 
            "Extension plugin \"%s\" (extension %s) allows multiple instances on \"%s\" substatement, which is not supported."
            ;
            goto LAB_00172a3c;
          }
          puVar10 = puVar2 + uVar9 * 6;
          uVar11 = *puVar10;
          uVar9 = (ulong)((int)uVar9 + 1);
        } while (uVar11 != 0);
      }
      uVar11 = (int)uVar12 + 1;
      uVar12 = (ulong)uVar11;
      plVar14 = plugin + uVar12;
      local_38 = plugin[uVar12].name;
    } while (local_38 != (char *)0x0);
  }
  plVar7 = (lyext_plugin_list *)realloc(ext_plugins,(ulong)(ext_plugins_count + uVar11) << 5);
  if (plVar7 == (lyext_plugin_list *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","ly_register_exts");
    iVar6 = -1;
  }
  else {
    iVar6 = 0;
    ext_plugins = plVar7;
    if (uVar11 != 0) {
      lVar13 = (ulong)uVar11 << 5;
      do {
        puVar1 = (undefined8 *)((long)&plugin[-1].module + lVar13);
        pcVar15 = (char *)*puVar1;
        pcVar8 = (char *)puVar1[1];
        puVar1 = (undefined8 *)((long)plugin + lVar13 + -0x10);
        plVar3 = (lyext_plugin *)puVar1[1];
        plVar7[ext_plugins_count].name = (char *)*puVar1;
        (&plVar7[ext_plugins_count].name)[1] = (char *)plVar3;
        plVar7[ext_plugins_count].module = pcVar15;
        plVar7[ext_plugins_count].revision = pcVar8;
        ext_plugins_count = ext_plugins_count + 1;
        lVar13 = lVar13 + -0x20;
        iVar6 = 0;
      } while (lVar13 != 0);
    }
  }
  return iVar6;
}

Assistant:

API int
ly_register_exts(struct lyext_plugin_list *plugin, const char *log_name)
{
    struct lyext_plugin_list *p;
    struct lyext_plugin_complex *pluginc;
    uint32_t u, v;

    for (u = 0; plugin[u].name; u++) {
        /* check extension implementations for collisions */
        for (v = 0; v < ext_plugins_count; v++) {
            if (!strcmp(plugin[u].name, ext_plugins[v].name) &&
                    !strcmp(plugin[u].module, ext_plugins[v].module) &&
                    (!plugin[u].revision || !ext_plugins[v].revision || !strcmp(plugin[u].revision, ext_plugins[v].revision))) {
                LOGERR(NULL, LY_ESYS, "Processing \"%s\" extension plugin failed,"
                        "implementation collision for extension %s from module %s%s%s.",
                        log_name, plugin[u].name, plugin[u].module, plugin[u].revision ? "@" : "",
                        plugin[u].revision ? plugin[u].revision : "");
                return 1;
            }
        }

        /* check for valid supported substatements in case of complex extension */
        if (plugin[u].plugin->type == LYEXT_COMPLEX && ((struct lyext_plugin_complex *)plugin[u].plugin)->substmt) {
            pluginc = (struct lyext_plugin_complex *)plugin[u].plugin;
            for (v = 0; pluginc->substmt[v].stmt; v++) {
                if (pluginc->substmt[v].stmt >= LY_STMT_SUBMODULE ||
                        pluginc->substmt[v].stmt == LY_STMT_VERSION ||
                        pluginc->substmt[v].stmt == LY_STMT_YINELEM) {
                    LOGERR(NULL, LY_EINVAL,
                            "Extension plugin \"%s\" (extension %s) allows not supported extension substatement (%s)",
                            log_name, plugin[u].name, ly_stmt_str[pluginc->substmt[v].stmt]);
                    return 1;
                }
                if (pluginc->substmt[v].cardinality > LY_STMT_CARD_MAND &&
                        pluginc->substmt[v].stmt >= LY_STMT_MODIFIER &&
                        pluginc->substmt[v].stmt <= LY_STMT_STATUS) {
                    LOGERR(NULL, LY_EINVAL, "Extension plugin \"%s\" (extension %s) allows multiple instances on \"%s\" "
                           "substatement, which is not supported.",
                           log_name, plugin[u].name, ly_stmt_str[pluginc->substmt[v].stmt]);
                    return 1;
                }
            }
        }
    }

    /* add the new plugins, we have number of new plugins as u */
    p = realloc(ext_plugins, (ext_plugins_count + u) * sizeof *ext_plugins);
    if (!p) {
        LOGMEM(NULL);
        return -1;
    }
    ext_plugins = p;
    for (; u; u--) {
        memcpy(&ext_plugins[ext_plugins_count], &plugin[u - 1], sizeof *plugin);
        ext_plugins_count++;
    }

    return 0;
}